

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O2

MoveList * __thiscall
libchess::Position::legal_move_list(MoveList *__return_storage_ptr__,Position *this,Color stm)

{
  Move move;
  pointer pMVar1;
  long lVar2;
  bool bVar3;
  Bitboard BVar4;
  ulong uVar5;
  pointer pMVar6;
  
  BVar4 = checkers_to(this,stm);
  if (BVar4.value_ == 0) {
    pseudo_legal_move_list(__return_storage_ptr__,this);
  }
  else {
    check_evasion_move_list(__return_storage_ptr__,this);
  }
  BVar4 = pinned_pieces_of(this,stm);
  pMVar6 = (__return_storage_ptr__->values_).
           super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
           super__Vector_impl_data._M_start;
LAB_00112051:
  do {
    if (pMVar6 == (__return_storage_ptr__->values_).
                  super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return __return_storage_ptr__;
    }
    move.value_ = pMVar6->value_;
    if (((BVar4.value_ >> (move.value_ & 0x3fU) & 1) == 0) && ((move.value_ & 0x38000U) != 0x18000))
    {
      uVar5 = this->piece_type_bb_[5].value_ &
              this->color_bb_[(int)stm.super_MetaValueType<int>.value_].value_;
      lVar2 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      if ((move.value_ & 0x3fU) == (uint)lVar2) goto LAB_00112087;
    }
    else {
LAB_00112087:
      bVar3 = is_legal_generated_move(this,move);
      if (!bVar3) {
        pMVar1 = (__return_storage_ptr__->values_).
                 super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pMVar6->value_ = pMVar1[-1].value_;
        (__return_storage_ptr__->values_).
        super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
        super__Vector_impl_data._M_finish = pMVar1 + -1;
        goto LAB_00112051;
      }
    }
    pMVar6 = pMVar6 + 1;
  } while( true );
}

Assistant:

inline MoveList Position::legal_move_list(Color stm) const {
    MoveList move_list = checkers_to(stm) ? check_evasion_move_list() : pseudo_legal_move_list();
    Bitboard pinned = pinned_pieces_of(stm);
    for (auto move = move_list.begin(); move != move_list.end();) {
        if (((pinned & Bitboard{move->from_square()}) || move->from_square() == king_square(stm) ||
             move->type() == Move::Type::ENPASSANT) &&
            !is_legal_generated_move(*move)) {
            *move = *(move_list.end() - 1);
            move_list.pop_back();
        } else {
            ++move;
        }
    }
    return move_list;
}